

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssl_asn1.cc
# Opt level: O3

int bssl::SSL_SESSION_parse_u16(CBS *cbs,uint16_t *out,CBS_ASN1_TAG tag,uint16_t default_value)

{
  bool bVar1;
  int iVar2;
  uint64_t value;
  ulong local_20;
  
  iVar2 = CBS_get_optional_asn1_uint64(cbs,&local_20,tag,0);
  bVar1 = local_20 < 0x10000 && iVar2 != 0;
  if (bVar1) {
    *out = (uint16_t)local_20;
  }
  else {
    ERR_put_error(0x10,0,0xa0,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_asn1.cc"
                  ,0x1c5);
  }
  return (uint)bVar1;
}

Assistant:

static int SSL_SESSION_parse_u16(CBS *cbs, uint16_t *out, CBS_ASN1_TAG tag,
                                 uint16_t default_value) {
  uint64_t value;
  if (!CBS_get_optional_asn1_uint64(cbs, &value, tag,
                                    (uint64_t)default_value) ||
      value > 0xffff) {
    OPENSSL_PUT_ERROR(SSL, SSL_R_INVALID_SSL_SESSION);
    return 0;
  }
  *out = (uint16_t)value;
  return 1;
}